

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cpp
# Opt level: O3

void __thiscall index_tree::build_index(index_tree *this,wstring *word)

{
  pointer psVar1;
  size_t i;
  ulong uVar2;
  
  psVar1 = (this->indexes_).
           super__Vector_base<std::shared_ptr<index>,_std::allocator<std::shared_ptr<index>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->current_index_).super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (psVar1->super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->current_index_).super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(psVar1->super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  if (word->_M_string_length != 0) {
    if (word->_M_string_length == 1) {
      index::build_index((this->current_index_).
                         super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>._M_ptr,word);
      return;
    }
    uVar2 = 1;
    do {
      index::build_index((this->current_index_).
                         super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>._M_ptr,word);
      uVar2 = uVar2 + 1;
    } while (uVar2 < word->_M_string_length);
  }
  return;
}

Assistant:

void index_tree::build_index(const std::wstring& word)
{
    // 将当前索引设置为一级索引
    set_current_index(1);

    if (word.size() == 1)
    {
        current_index_->build_index(word);
    }
    else
    {
        for (std::size_t i = 1; i < word.size(); ++i)
        {
            current_index_->build_index(word);
        }
    }
}